

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O0

SyscallResult
kj::_::Debug::syscall<kj::resetCrashHandlers()::__0>(anon_class_8_1_4c536f74 *call,bool nonblocking)

{
  int iVar1;
  int errorNum;
  bool nonblocking_local;
  anon_class_8_1_4c536f74 *call_local;
  
  do {
    iVar1 = resetCrashHandlers::anon_class_8_1_4c536f74::operator()(call);
    if (-1 < iVar1) {
      SyscallResult::SyscallResult((SyscallResult *)((long)&call_local + 4),0);
      return (SyscallResult)call_local._4_4_;
    }
    iVar1 = getOsErrorNumber(nonblocking);
  } while (iVar1 == -1);
  SyscallResult::SyscallResult((SyscallResult *)((long)&call_local + 4),iVar1);
  return (SyscallResult)call_local._4_4_;
}

Assistant:

Debug::SyscallResult Debug::syscall(Call&& call, bool nonblocking) {
  while (call() < 0) {
    int errorNum = getOsErrorNumber(nonblocking);
    // getOsErrorNumber() returns -1 to indicate EINTR.
    // Also, if nonblocking is true, then it returns 0 on EAGAIN, which will then be treated as a
    // non-error.
    if (errorNum != -1) {
      return SyscallResult(errorNum);
    }
  }
  return SyscallResult(0);
}